

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::_save_jpeg
          (CImg<unsigned_char> *this,FILE *file,char *filename,uint quality)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uchar *puVar5;
  bool bVar6;
  CImgArgumentException *this_00;
  char *pcVar7;
  char *pcVar8;
  CImgInstanceException *this_01;
  CImg<unsigned_char> *pCVar9;
  CImgIOException *this_02;
  undefined4 in_ECX;
  char *in_RDX;
  long in_RSI;
  CImg<unsigned_char> *in_RDI;
  char *local_d8;
  char *local_a8;
  uint in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  
  if ((in_RSI == 0) && (in_RDX == (char *)0x0)) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x4008);
    uVar1 = in_RDI->_width;
    uVar2 = in_RDI->_height;
    uVar3 = in_RDI->_depth;
    uVar4 = in_RDI->_spectrum;
    puVar5 = in_RDI->_data;
    pcVar7 = "non-";
    if ((in_RDI->_is_shared & 1U) != 0) {
      pcVar7 = "";
    }
    pcVar8 = pixel_type();
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::save_jpeg() : Specified filename is (null)."
               ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,puVar5,pcVar7,pcVar8);
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,
                CImgArgumentException::~CImgArgumentException);
  }
  bVar6 = is_empty(in_RDI);
  if (bVar6) {
    this_01 = (CImgInstanceException *)__cxa_allocate_exception(0x4008);
    uVar1 = in_RDI->_width;
    uVar2 = in_RDI->_height;
    uVar3 = in_RDI->_depth;
    uVar4 = in_RDI->_spectrum;
    puVar5 = in_RDI->_data;
    pcVar7 = "non-";
    if ((in_RDI->_is_shared & 1U) != 0) {
      pcVar7 = "";
    }
    pcVar8 = pixel_type();
    local_a8 = in_RDX;
    if (in_RDX == (char *)0x0) {
      local_a8 = "(FILE*)";
    }
    CImgInstanceException::CImgInstanceException
              (this_01,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::save_jpeg() : Empty instance, for file \'%s\'."
               ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,puVar5,pcVar7,pcVar8,local_a8);
    __cxa_throw(this_01,&CImgInstanceException::typeinfo,
                CImgInstanceException::~CImgInstanceException);
  }
  if (1 < in_RDI->_depth) {
    uVar1 = in_RDI->_width;
    uVar2 = in_RDI->_height;
    uVar3 = in_RDI->_depth;
    uVar4 = in_RDI->_spectrum;
    puVar5 = in_RDI->_data;
    pcVar7 = "non-";
    if ((in_RDI->_is_shared & 1U) != 0) {
      pcVar7 = "";
    }
    pcVar8 = pixel_type();
    local_d8 = in_RDX;
    if (in_RDX == (char *)0x0) {
      local_d8 = "(FILE*)";
    }
    cimg::warn("[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::save_jpeg() : Instance is volumetric, only the first slice will be saved in file \'%s\'."
               ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,puVar5,pcVar7,pcVar8,local_d8);
  }
  if (in_RSI != 0) {
    this_02 = (CImgIOException *)__cxa_allocate_exception(0x4008);
    uVar1 = in_RDI->_width;
    uVar2 = in_RDI->_height;
    uVar3 = in_RDI->_depth;
    uVar4 = in_RDI->_spectrum;
    puVar5 = in_RDI->_data;
    pcVar7 = "non-";
    if ((in_RDI->_is_shared & 1U) != 0) {
      pcVar7 = "";
    }
    pcVar8 = pixel_type();
    CImgIOException::CImgIOException
              (this_02,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::save_jpeg() : Unable to save data in \'(*FILE)\' unless libjpeg is enabled."
               ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,puVar5,pcVar7,pcVar8);
    __cxa_throw(this_02,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
  }
  pCVar9 = save_other((CImg<unsigned_char> *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                      in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  return pCVar9;
}

Assistant:

const CImg<T>& _save_jpeg(std::FILE *const file, const char *const filename, const unsigned int quality) const {
      if (!file && !filename)
        throw CImgArgumentException(_cimg_instance
                                    "save_jpeg() : Specified filename is (null).",
                                    cimg_instance);
      if (is_empty())
        throw CImgInstanceException(_cimg_instance
                                    "save_jpeg() : Empty instance, for file '%s'.",
                                    cimg_instance,
                                    filename?filename:"(FILE*)");
      if (_depth>1)
        cimg::warn(_cimg_instance
                   "save_jpeg() : Instance is volumetric, only the first slice will be saved in file '%s'.",
                   cimg_instance,
                   filename?filename:"(FILE*)");

#ifndef cimg_use_jpeg
      if (!file) return save_other(filename,quality);
      else throw CImgIOException(_cimg_instance
                                 "save_jpeg() : Unable to save data in '(*FILE)' unless libjpeg is enabled.",
                                 cimg_instance);
#else
      unsigned int dimbuf = 0;
      J_COLOR_SPACE colortype = JCS_RGB;

      switch(_spectrum) {
      case 1 : dimbuf = 1; colortype = JCS_GRAYSCALE; break;
      case 2 : dimbuf = 3; colortype = JCS_RGB; break;
      case 3 : dimbuf = 3; colortype = JCS_RGB; break;
      default: dimbuf = 4; colortype = JCS_CMYK; break;
      }

      // Call libjpeg functions
      struct jpeg_compress_struct cinfo;
      struct jpeg_error_mgr jerr;
      cinfo.err = jpeg_std_error(&jerr);
      jpeg_create_compress(&cinfo);
      std::FILE *const nfile = file?file:cimg::fopen(filename,"wb");
      jpeg_stdio_dest(&cinfo,nfile);
      cinfo.image_width = _width;
      cinfo.image_height = _height;
      cinfo.input_components = dimbuf;
      cinfo.in_color_space = colortype;
      jpeg_set_defaults(&cinfo);
      jpeg_set_quality(&cinfo,quality<100?quality:100,TRUE);
      jpeg_start_compress(&cinfo,TRUE);

      JSAMPROW row_pointer[1];
      CImg<ucharT> buffer(_width*dimbuf);

      while (cinfo.next_scanline < cinfo.image_height) {
        unsigned char *ptrd = buffer._data;

        // Fill pixel buffer
        switch (_spectrum) {
        case 1 : { // Greyscale images
          const T *ptr_g = data(0, cinfo.next_scanline);
          for(unsigned int b = 0; b < cinfo.image_width; b++)
            *(ptrd++) = (unsigned char)*(ptr_g++);
        } break;
        case 2 : { // RG images
          const T *ptr_r = data(0,cinfo.next_scanline,0,0),
            *ptr_g = data(0,cinfo.next_scanline,0,1);
          for(unsigned int b = 0; b < cinfo.image_width; ++b) {
            *(ptrd++) = (unsigned char)*(ptr_r++);
            *(ptrd++) = (unsigned char)*(ptr_g++);
            *(ptrd++) = 0;
          }
        } break;
        case 3 : { // RGB images
          const T *ptr_r = data(0,cinfo.next_scanline,0,0),
            *ptr_g = data(0,cinfo.next_scanline,0,1),
            *ptr_b = data(0,cinfo.next_scanline,0,2);
          for(unsigned int b = 0; b < cinfo.image_width; ++b) {
            *(ptrd++) = (unsigned char)*(ptr_r++);
            *(ptrd++) = (unsigned char)*(ptr_g++);
            *(ptrd++) = (unsigned char)*(ptr_b++);
          }
        } break;
        default : { // CMYK images
          const T *ptr_r = data(0,cinfo.next_scanline,0,0),
            *ptr_g = data(0,cinfo.next_scanline,0,1),
            *ptr_b = data(0,cinfo.next_scanline,0,2),
            *ptr_a = data(0,cinfo.next_scanline,0,3);
          for(unsigned int b = 0; b < cinfo.image_width; ++b) {
            *(ptrd++) = (unsigned char)*(ptr_r++);
            *(ptrd++) = (unsigned char)*(ptr_g++);
            *(ptrd++) = (unsigned char)*(ptr_b++);
            *(ptrd++) = (unsigned char)*(ptr_a++);
          }
        }
        }
        *row_pointer = buffer._data;
        jpeg_write_scanlines(&cinfo,row_pointer,1);
      }
      jpeg_finish_compress(&cinfo);
      if (!file) cimg::fclose(nfile);
      jpeg_destroy_compress(&cinfo);
      return *this;
#endif
    }